

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_widget_layout_states nk_widget_fitting(nk_rect *bounds,nk_context *ctx,nk_vec2 item_padding)

{
  nk_panel *pnVar1;
  nk_vec2 nVar2;
  float local_4c;
  nk_vec2 panel_padding;
  nk_widget_layout_states state;
  nk_panel *layout;
  nk_style *style;
  nk_window *win;
  nk_context *ctx_local;
  nk_rect *bounds_local;
  nk_vec2 item_padding_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x4a17,
                  "enum nk_widget_layout_states nk_widget_fitting(struct nk_rect *, struct nk_context *, struct nk_vec2)"
                 );
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x4a18,
                  "enum nk_widget_layout_states nk_widget_fitting(struct nk_rect *, struct nk_context *, struct nk_vec2)"
                 );
  }
  if (ctx->current->layout == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x4a19,
                  "enum nk_widget_layout_states nk_widget_fitting(struct nk_rect *, struct nk_context *, struct nk_vec2)"
                 );
  }
  if (((ctx == (nk_context *)0x0) || (ctx->current == (nk_window *)0x0)) ||
     (ctx->current->layout == (nk_panel *)0x0)) {
    item_padding_local.x = 0.0;
  }
  else {
    pnVar1 = ctx->current->layout;
    item_padding_local.x = (float)nk_widget(bounds,ctx);
    nVar2 = nk_panel_get_padding(&ctx->style,pnVar1->type);
    bounds_local._4_4_ = item_padding.x;
    local_4c = nVar2.x;
    if ((pnVar1->row).index == 1) {
      bounds->w = local_4c + bounds->w;
      bounds->x = bounds->x - local_4c;
    }
    else {
      bounds->x = bounds->x - bounds_local._4_4_;
    }
    if ((pnVar1->row).index == (pnVar1->row).columns) {
      bounds->w = local_4c + bounds->w;
    }
    else {
      bounds->w = bounds_local._4_4_ + bounds->w;
    }
  }
  return (nk_widget_layout_states)item_padding_local.x;
}

Assistant:

NK_API enum nk_widget_layout_states
nk_widget_fitting(struct nk_rect *bounds, struct nk_context *ctx,
    struct nk_vec2 item_padding)
{
    /* update the bounds to stand without padding  */
    struct nk_window *win;
    struct nk_style *style;
    struct nk_panel *layout;
    enum nk_widget_layout_states state;
    struct nk_vec2 panel_padding;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return NK_WIDGET_INVALID;

    win = ctx->current;
    style = &ctx->style;
    layout = win->layout;
    state = nk_widget(bounds, ctx);

    panel_padding = nk_panel_get_padding(style, layout->type);
    if (layout->row.index == 1) {
        bounds->w += panel_padding.x;
        bounds->x -= panel_padding.x;
    } else bounds->x -= item_padding.x;

    if (layout->row.index == layout->row.columns)
        bounds->w += panel_padding.x;
    else bounds->w += item_padding.x;
    return state;
}